

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::removeSecondColumnSingletonInDoubletonRow(HPresolve *this,int j,int i)

{
  int *piVar1;
  iterator *piVar2;
  double dVar3;
  pointer piVar4;
  _Elt_pointer pcVar5;
  pointer pdVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  int local_30;
  change local_2c;
  
  piVar4 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = j;
  if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= (ulong)(long)i
     ) {
LAB_00141fb0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  piVar4[i] = 0;
  uVar9 = (ulong)j;
  pdVar6 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_HPreData).colCost.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar9)
  goto LAB_00141fb0;
  dVar11 = pdVar6[uVar9];
  if (dVar11 <= 0.0) {
    pdVar6 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(this->super_HPreData).colUpper.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
    if (0.0 <= dVar11) {
      if (uVar8 <= uVar9) goto LAB_00141fb0;
      dVar3 = pdVar6[uVar9];
      dVar11 = 0.0;
      if (0.0 <= dVar3) {
        pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
        if (uVar8 <= uVar9) goto LAB_00141fb0;
        if (pdVar6[uVar9] <= 0.0) goto LAB_00141ec9;
      }
      else {
        pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
      }
      if (uVar8 <= uVar9) goto LAB_00141fb0;
      dVar11 = dVar3;
      if (ABS(pdVar6[uVar9]) <= ABS(dVar3)) {
        dVar11 = pdVar6[uVar9];
      }
      goto LAB_00141ec9;
    }
    if (uVar8 <= uVar9) goto LAB_00141fb0;
    dVar11 = pdVar6[uVar9];
    bVar10 = dVar11 == 1e+200;
  }
  else {
    pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar9)
    goto LAB_00141fb0;
    dVar11 = pdVar6[uVar9];
    bVar10 = dVar11 == -1e+200;
  }
  if ((bVar10) && (!NAN(dVar11))) {
    if (0 < this->iPrint) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PR: Problem unbounded.",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    this->status = 2;
    return;
  }
LAB_00141ec9:
  setPrimalValue(this,j,dVar11);
  local_2c.type = 0x14;
  local_2c.row = 0;
  pcVar5 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_2c.col = j;
  if (pcVar5 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x10) + -1) {
    std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
              ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,&local_2c);
  }
  else {
    pcVar5->col = j;
    pcVar5->type = 0x14;
    pcVar5->row = 0;
    piVar2 = &(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar2->_M_cur = piVar2->_M_cur + 1;
  }
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Second singleton column ",0x1c);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," in doubleton row ",0x12);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," removed.\n",10);
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 8;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::list<int,_std::allocator<int>_>::remove(&this->singCol,(char *)&local_30);
  return;
}

Assistant:

void HPresolve::removeSecondColumnSingletonInDoubletonRow(const int j, const int i) {
	// case two singleton columns
	// when we get here bounds on xj are updated so we can choose low/upper one
	// depending on the cost of xj
	flagRow.at(i) = 0;
	double value;
	if (colCost.at(j) > 0) {
		if (colLower.at(j) == -HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colLower.at(j);
	} else if (colCost.at(j) < 0) {
		if (colUpper.at(j) == HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colUpper.at(j);
	} else { //(colCost.at(j) == 0)
		if (colUpper.at(j) >= 0 && colLower.at(j) <= 0)
			value = 0;
		else if (abs(colUpper.at(j)) < abs(colLower.at(j)))
			value = colUpper.at(j);
		else
			value = colLower.at(j);
	}
	setPrimalValue(j, value);
	addChange(SING_COL_DOUBLETON_INEQ_SECOND_SING_COL, 0, j);
	if (iPrint > 0)
		cout << "PR: Second singleton column " << j << " in doubleton row " << i
				<< " removed.\n";
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	singCol.remove(j);
}